

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickManager.cpp
# Opt level: O1

void __thiscall sf::priv::JoystickManager::update(JoystickManager *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int __oflag;
  JoystickState *pJVar4;
  JoystickImpl *pJVar5;
  ulong uVar6;
  byte bVar7;
  JoystickCaps JVar8;
  JoystickState local_70;
  
  bVar7 = 0;
  uVar6 = 0;
  do {
    if ((char)((JoystickImpl *)((long)this + 0xb0))->m_file == '\x01') {
      JoystickImpl::update(&local_70,(JoystickImpl *)this);
      pJVar4 = &local_70;
      pJVar5 = (JoystickImpl *)((long)this + 0xb0);
      for (lVar3 = 0x11; lVar3 != 0; lVar3 = lVar3 + -1) {
        pJVar5->m_file = *(int *)pJVar4;
        pJVar4 = (JoystickState *)((long)pJVar4 + (ulong)bVar7 * -8 + 4);
        pJVar5 = (JoystickImpl *)((long)pJVar5 + (ulong)bVar7 * -8 + 4);
      }
      if ((char)((JoystickImpl *)((long)this + 0xb0))->m_file == '\0') {
        JoystickImpl::close((JoystickImpl *)this,(int)pJVar4);
        *(undefined4 *)&((JoystickImpl *)((long)this + 0xb0))->m_state = 0;
        (((JoystickImpl *)((long)this + 0xb0))->m_state).axes[0] = 0.0;
        (((JoystickImpl *)((long)this + 0xb0))->m_state).axes[1] = 0.0;
        local_70.axes._15_5_ = 0;
        local_70.axes[5]._0_3_ = 0;
        local_70.axes._23_4_ = 0;
        local_70.axes._27_4_ = 0;
        local_70._3_1_ = 0;
        local_70.axes[0] = 0.0;
        local_70.axes[1]._0_3_ = 0;
        local_70.axes._7_5_ = 0;
        local_70.axes[3]._0_3_ = 0;
        *(undefined1 *)&((JoystickImpl *)((long)this + 0xb0))->m_file = 0;
        *(ulong *)((long)&((JoystickImpl *)((long)this + 0xb0))->m_file + 1) =
             (ulong)(uint3)local_70._0_3_;
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[5] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[6] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[7] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[8] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[9] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[10] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0xb] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0xc] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0xd] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0xe] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0xf] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x10] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x11] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x12] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x13] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x14] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x15] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x16] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x17] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x18] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x19] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x1a] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x1b] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x1c] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x1c] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x1d] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x1e] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x1f] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x20] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x21] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x22] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x23] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x24] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x25] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x26] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x27] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x28] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x29] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x2a] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x2b] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x2c] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x2d] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x2e] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x2f] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x30] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x31] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x32] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x33] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x34] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x35] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x36] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x37] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x38] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x39] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x3a] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x3b] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x3c] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x3d] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x3e] = '\0';
        ((JoystickImpl *)((long)this + 0xb0))->m_mapping[0x3f] = '\0';
        Joystick::Identification::Identification((Identification *)&local_70);
        String::operator=((String *)((((JoystickImpl *)((long)this + 0xb0))->m_state).axes + 2),
                          (String *)&local_70);
LAB_0019e44a:
        *(ulong *)((((JoystickImpl *)((long)this + 0xb0))->m_state).buttons + 8) =
             CONCAT53(local_70._35_5_,local_70.axes[7]._0_3_);
        if ((float *)CONCAT53(local_70._3_5_,local_70._0_3_) != local_70.axes + 3) {
          operator_delete((undefined1 *)CONCAT53(local_70._3_5_,local_70._0_3_));
        }
      }
    }
    else {
      bVar1 = JoystickImpl::isConnected((uint)uVar6);
      if (bVar1) {
        iVar2 = JoystickImpl::open((JoystickImpl *)this,(char *)(uVar6 & 0xffffffff),__oflag);
        if ((char)iVar2 != '\0') {
          JVar8 = JoystickImpl::getCapabilities((JoystickImpl *)this);
          *(JoystickCaps *)&((JoystickImpl *)((long)this + 0xb0))->m_state = JVar8;
          JoystickImpl::update(&local_70,(JoystickImpl *)this);
          pJVar4 = &local_70;
          pJVar5 = (JoystickImpl *)((long)this + 0xb0);
          for (lVar3 = 0x11; lVar3 != 0; lVar3 = lVar3 + -1) {
            pJVar5->m_file = *(int *)pJVar4;
            pJVar4 = (JoystickState *)((long)pJVar4 + (ulong)bVar7 * -8 + 4);
            pJVar5 = (JoystickImpl *)((long)pJVar5 + (ulong)bVar7 * -8 + 4);
          }
          JoystickImpl::getIdentification((Identification *)&local_70,(JoystickImpl *)this);
          String::operator=((String *)((((JoystickImpl *)((long)this + 0xb0))->m_state).axes + 2),
                            (String *)&local_70);
          goto LAB_0019e44a;
        }
      }
    }
    uVar6 = uVar6 + 1;
    this = (JoystickManager *)((((JoystickImpl *)((long)this + 0xb0))->m_state).buttons + 0x10);
    if (uVar6 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void JoystickManager::update()
{
    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        Item& item = m_joysticks[i];

        if (item.state.connected)
        {
            // Get the current state of the joystick
            item.state = item.joystick.update();

            // Check if it's still connected
            if (!item.state.connected)
            {
                item.joystick.close();
                item.capabilities   = JoystickCaps();
                item.state          = JoystickState();
                item.identification = Joystick::Identification();
            }
        }
        else
        {
            // Check if the joystick was connected since last update
            if (JoystickImpl::isConnected(i))
            {
                if (item.joystick.open(i))
                {
                    item.capabilities   = item.joystick.getCapabilities();
                    item.state          = item.joystick.update();
                    item.identification = item.joystick.getIdentification();
                }
            }
        }
    }
}